

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O0

void __thiscall
eos::render::Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
          (Rasterizer<eos::render::ExtractionFragmentShader> *this,Vertex<double> *point_a,
          Vertex<double> *point_b,Vertex<double> *point_c,optional<eos::render::Texture> *texture)

{
  double dVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  double dVar6;
  double dVar7;
  float x_00;
  float y_00;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  CoeffReturnType pdVar14;
  CoeffReturnType pdVar15;
  CoeffReturnType pdVar16;
  CoeffReturnType pdVar17;
  CoeffReturnType pdVar18;
  double *pdVar19;
  Texture *pTVar20;
  const_reference pvVar21;
  Scalar *pSVar22;
  Pixel<unsigned_char,_4> *pPVar23;
  uchar *puVar24;
  double dVar25;
  double dVar26;
  __type_conflict _Var27;
  double local_338;
  uchar local_329;
  double dStack_328;
  uchar alpha_1;
  uchar local_319;
  double dStack_318;
  uchar blue;
  uchar local_309;
  double dStack_308;
  uchar green;
  uchar local_2f9;
  undefined1 local_2f8 [7];
  uchar red;
  Vector4<double> local_2d8;
  float local_2b8;
  float local_2b4;
  float dvdy;
  float dvdx;
  float dudy;
  float dudx;
  float one_over_squared_one_over_z;
  float one_over_z;
  float v_over_z;
  float u_over_z;
  Vector4<double> pixel_color;
  Vector3<double> lambda;
  double d;
  bool passes_depth_test;
  bool draw;
  double z_affine;
  int pixel_index_col;
  int pixel_index_row;
  double gamma;
  double beta;
  double alpha;
  double one_over_v2ToLine01;
  double one_over_v1ToLine20;
  double one_over_v0ToLine12;
  float local_208;
  float y;
  float x;
  int xi;
  int yi;
  float gamma_ffy;
  float beta_ffy;
  float alpha_ffy;
  float gamma_ffx;
  float beta_ffx;
  float alpha_ffx;
  float one_over_gamma_c;
  float one_over_beta_c;
  float one_over_alpha_c;
  Matrix<double,_3,_1,_0,_3,_1> local_1c0;
  Matrix<double,_3,_1,_0,_3,_1> local_1a8;
  undefined1 local_190 [8];
  plane gamma_plane;
  Matrix<double,_3,_1,_0,_3,_1> local_178;
  double local_160;
  Matrix<double,_3,_1,_0,_3,_1> local_158;
  double local_140;
  Matrix<double,_3,_1,_0,_3,_1> local_138;
  undefined1 local_120 [8];
  plane beta_plane;
  Matrix<double,_3,_1,_0,_3,_1> local_108;
  double local_f0;
  Matrix<double,_3,_1,_0,_3,_1> local_e8;
  double local_d0;
  Matrix<double,_3,_1,_0,_3,_1> local_c8;
  undefined1 local_b0 [8];
  plane alpha_plane;
  double *one_over_w2;
  double *one_over_w1;
  double *one_over_w0;
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  Vector2<double> local_68;
  Vector2<double> local_58;
  undefined1 local_40 [8];
  Rect<int> boundingBox;
  optional<eos::render::Texture> *texture_local;
  Vertex<double> *point_c_local;
  Vertex<double> *point_b_local;
  Vertex<double> *point_a_local;
  Rasterizer<eos::render::ExtractionFragmentShader> *this_local;
  
  boundingBox._8_8_ = texture;
  pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::x
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a);
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)&local_58,pdVar14,pdVar15);
  pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::x
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b);
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)&local_68,pdVar14,pdVar15);
  pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::x
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c);
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::y
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,2,1,0,2,1> *)&max_x,pdVar14,pdVar15);
  _local_40 = detail::calculate_clipped_bounding_box<double>
                        (&local_58,&local_68,(Vector2<double> *)&max_x,this->viewport_width,
                         this->viewport_height);
  uVar8 = local_40._0_4_;
  iVar11 = local_40._0_4_ + boundingBox.x;
  uVar9 = local_40._4_4_;
  iVar12 = local_40._4_4_ + boundingBox.y;
  pdVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,3);
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,3);
  alpha_plane._8_8_ =
       Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                 ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,3);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,1);
  pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                       &point_a->texcoords,0);
  local_d0 = *pdVar18 * *pdVar14;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_c8,pdVar16,pdVar17,&local_d0);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,1);
  pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                       &point_b->texcoords,0);
  local_f0 = *pdVar18 * *pdVar15;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_e8,pdVar16,pdVar17,&local_f0);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,1);
  pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                       &point_c->texcoords,0);
  beta_plane._8_8_ = *pdVar18 * *(double *)alpha_plane._8_8_;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_108,pdVar16,pdVar17,(Scalar *)&beta_plane.c);
  detail::plane::plane<double>((plane *)local_b0,&local_c8,&local_e8,&local_108);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,1);
  pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                       &point_a->texcoords,1);
  local_140 = *pdVar18 * *pdVar14;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_138,pdVar16,pdVar17,&local_140);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,1);
  pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                       &point_b->texcoords,1);
  local_160 = *pdVar18 * *pdVar15;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_158,pdVar16,pdVar17,&local_160);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,1);
  pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                       &point_c->texcoords,1);
  gamma_plane._8_8_ = *pdVar18 * *(double *)alpha_plane._8_8_;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_178,pdVar16,pdVar17,(Scalar *)&gamma_plane.c);
  detail::plane::plane<double>((plane *)local_120,&local_138,&local_158,&local_178);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,1);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_1a8,pdVar16,pdVar17,pdVar14);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,1);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_1c0,pdVar16,pdVar17,pdVar15);
  pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,0);
  pdVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,1);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)&one_over_beta_c,pdVar16,pdVar17,
             (Scalar *)alpha_plane._8_8_);
  detail::plane::plane<double>
            ((plane *)local_190,&local_1a8,&local_1c0,(Vector3<double> *)&one_over_beta_c);
  one_over_gamma_c = 1.0 / alpha_plane.a;
  alpha_ffx = 1.0 / beta_plane.a;
  beta_ffx = 1.0 / gamma_plane.a;
  gamma_ffx = -(float)local_b0._0_4_ * one_over_gamma_c;
  alpha_ffy = -(float)local_120._0_4_ * alpha_ffx;
  beta_ffy = -(float)local_190._0_4_ * beta_ffx;
  gamma_ffy = -(float)local_b0._4_4_ * one_over_gamma_c;
  yi = (int)(-(float)local_120._4_4_ * alpha_ffx);
  xi = (int)(-(float)local_190._4_4_ * beta_ffx);
  for (x = (float)uVar9; (int)x <= iVar12; x = (float)((int)x + 1)) {
    for (y = (float)uVar8; (int)y <= iVar11; y = (float)((int)y + 1)) {
      local_208 = (float)(int)y + 0.5;
      one_over_v0ToLine12._4_4_ = (float)(int)x + 0.5;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,0);
      dVar25 = *pdVar16;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,1);
      dVar25 = detail::implicit_line<double>
                         ((float)dVar25,(float)*pdVar16,&point_b->position,&point_c->position);
      one_over_v1ToLine20 = 1.0 / dVar25;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,0);
      dVar25 = *pdVar16;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,1);
      dVar25 = detail::implicit_line<double>
                         ((float)dVar25,(float)*pdVar16,&point_c->position,&point_a->position);
      one_over_v2ToLine01 = 1.0 / dVar25;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,0);
      dVar25 = *pdVar16;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,1);
      dVar25 = detail::implicit_line<double>
                         ((float)dVar25,(float)*pdVar16,&point_a->position,&point_b->position);
      alpha = 1.0 / dVar25;
      dVar25 = detail::implicit_line<double>
                         (local_208,one_over_v0ToLine12._4_4_,&point_b->position,&point_c->position)
      ;
      beta = dVar25 * one_over_v1ToLine20;
      dVar25 = detail::implicit_line<double>
                         (local_208,one_over_v0ToLine12._4_4_,&point_c->position,&point_a->position)
      ;
      gamma = dVar25 * one_over_v2ToLine01;
      _pixel_index_col =
           detail::implicit_line<double>
                     (local_208,one_over_v0ToLine12._4_4_,&point_a->position,&point_b->position);
      y_00 = x;
      x_00 = y;
      dVar25 = beta;
      _pixel_index_col = _pixel_index_col * alpha;
      if (((0.0 <= beta) && (0.0 <= gamma)) && (0.0 <= _pixel_index_col)) {
        pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_a,2);
        dVar7 = gamma;
        dVar26 = *pdVar16;
        pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_b,2);
        dVar6 = _pixel_index_col;
        dVar1 = *pdVar16;
        pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)point_c,2);
        dVar25 = dVar6 * *pdVar16 + dVar25 * dVar26 + dVar7 * dVar1;
        bVar10 = this->enable_far_clipping;
        bVar2 = false;
        if ((this->enable_depth_test & 1U) != 0) {
          pdVar19 = core::Image<double>::operator()(&this->depthbuffer,(int)y_00,(int)x_00);
          bVar2 = dVar25 < *pdVar19;
        }
        if (((bVar2) && ((bVar10 & 1U) == 0 || dVar25 <= 1.0)) ||
           ((this->enable_depth_test & 1U) == 0)) {
          if ((this->perspective_correct_barycentric_weights & 1U) != 0) {
            dVar26 = 1.0 / (_pixel_index_col * *(double *)alpha_plane._8_8_ +
                           beta * *pdVar14 + gamma * *pdVar15);
            beta = dVar26 * *pdVar14 * beta;
            gamma = dVar26 * *pdVar15 * gamma;
            _pixel_index_col = dVar26 * *(double *)alpha_plane._8_8_ * _pixel_index_col;
          }
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)
                     (pixel_color.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3),&beta,&gamma,(Scalar *)&pixel_index_col);
          Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)&v_over_z);
          bVar10 = std::optional::operator_cast_to_bool((optional *)boundingBox._8_8_);
          if (bVar10) {
            one_over_z = -((float)local_b0._0_4_ * local_208 +
                           (float)local_b0._4_4_ * one_over_v0ToLine12._4_4_ + alpha_plane.b) *
                         one_over_gamma_c;
            one_over_squared_one_over_z =
                 -((float)local_120._0_4_ * local_208 +
                   (float)local_120._4_4_ * one_over_v0ToLine12._4_4_ + beta_plane.b) * alpha_ffx;
            dudx = -((float)local_190._0_4_ * local_208 +
                     (float)local_190._4_4_ * one_over_v0ToLine12._4_4_ + gamma_plane.b) * beta_ffx;
            _Var27 = std::pow<float,int>(dudx,2);
            dudy = (float)(1.0 / _Var27);
            dvdx = dudy * (gamma_ffx * dudx + -(one_over_z * beta_ffy));
            dvdy = dudy * (alpha_ffy * dudx + -(one_over_squared_one_over_z * beta_ffy));
            local_2b4 = dudy * (gamma_ffy * dudx + -(one_over_z * (float)xi));
            local_2b8 = dudy * ((float)yi * dudx + -(one_over_squared_one_over_z * (float)xi));
            pTVar20 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar21 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar20->mipmaps,0);
            iVar13 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar21);
            dvdx = (float)iVar13 * dvdx;
            pTVar20 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar21 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar20->mipmaps,0);
            iVar13 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::width(pvVar21);
            dvdy = (float)iVar13 * dvdy;
            pTVar20 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar21 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar20->mipmaps,0);
            iVar13 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar21);
            local_2b4 = (float)iVar13 * local_2b4;
            pTVar20 = std::optional<eos::render::Texture>::value
                                ((optional<eos::render::Texture> *)boundingBox._8_8_);
            pvVar21 = std::
                      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                      ::operator[](&pTVar20->mipmaps,0);
            iVar13 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::height(pvVar21);
            local_2b8 = (float)iVar13 * local_2b8;
            ExtractionFragmentShader::shade_triangle_pixel<double>
                      (&local_2d8,(ExtractionFragmentShader *)this,(int)local_208,
                       (int)one_over_v0ToLine12._4_4_,point_a,point_b,point_c,
                       (Vector3<double> *)
                       (pixel_color.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array + 3),
                       (optional<eos::render::Texture> *)boundingBox._8_8_,dvdx,dvdy,local_2b4,
                       local_2b8);
            Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                      ((Matrix<double,_4,_1,_0,_4,_1> *)&v_over_z,&local_2d8);
          }
          else {
            ExtractionFragmentShader::shade_triangle_pixel<double>
                      ((Vector4<double> *)local_2f8,(ExtractionFragmentShader *)this,(int)local_208,
                       (int)one_over_v0ToLine12._4_4_,point_a,point_b,point_c,
                       (Vector3<double> *)
                       (pixel_color.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                        m_storage.m_data.array + 3),
                       (optional<eos::render::Texture> *)boundingBox._8_8_,0.0,0.0,0.0,0.0);
            Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
                      ((Matrix<double,_4,_1,_0,_4,_1> *)&v_over_z,
                       (Matrix<double,_4,_1,_0,_4,_1> *)local_2f8);
          }
          pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&v_over_z
                               ,0);
          dStack_308 = 1.0;
          pdVar19 = std::min<double>(pSVar22,&stack0xfffffffffffffcf8);
          local_2f9 = (uchar)(int)(*pdVar19 * 255.0);
          pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&v_over_z
                               ,1);
          dStack_318 = 1.0;
          pdVar19 = std::min<double>(pSVar22,&stack0xfffffffffffffce8);
          local_309 = (uchar)(int)(*pdVar19 * 255.0);
          pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&v_over_z
                               ,2);
          dStack_328 = 1.0;
          pdVar19 = std::min<double>(pSVar22,&stack0xfffffffffffffcd8);
          local_319 = (uchar)(int)(*pdVar19 * 255.0);
          pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&v_over_z
                               ,3);
          local_338 = 1.0;
          pdVar19 = std::min<double>(pSVar22,&local_338);
          uVar3 = local_319;
          local_329 = (uchar)(int)(*pdVar19 * 255.0);
          pPVar23 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)y_00,(int)x_00);
          puVar24 = core::Pixel<unsigned_char,_4>::operator[](pPVar23,0);
          uVar4 = local_309;
          *puVar24 = uVar3;
          pPVar23 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)y_00,(int)x_00);
          puVar24 = core::Pixel<unsigned_char,_4>::operator[](pPVar23,1);
          uVar5 = local_2f9;
          *puVar24 = uVar4;
          pPVar23 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)y_00,(int)x_00);
          puVar24 = core::Pixel<unsigned_char,_4>::operator[](pPVar23,2);
          uVar3 = local_329;
          *puVar24 = uVar5;
          pPVar23 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                              (&this->colorbuffer,(int)y_00,(int)x_00);
          puVar24 = core::Pixel<unsigned_char,_4>::operator[](pPVar23,3);
          *puVar24 = uVar3;
          if ((this->enable_depth_test & 1U) != 0) {
            pdVar19 = core::Image<double>::operator()(&this->depthbuffer,(int)y_00,(int)x_00);
            *pdVar19 = dVar25;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }